

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O3

_Bool target_set_interactive(wchar_t mode,wchar_t x,wchar_t y)

{
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  object *obj;
  chunk_conflict *pcVar6;
  byte bVar7;
  _Bool _Var8;
  _Bool monster;
  _Bool _Var9;
  char cVar10;
  ushort uVar11;
  int iVar12;
  errr eVar13;
  wchar_t wVar14;
  object *o;
  loc lVar15;
  undefined8 extraout_RAX;
  monster *pmVar16;
  object *poVar17;
  loc grid2;
  ulong uVar18;
  undefined7 extraout_var_00;
  loc_conflict lVar19;
  command_conflict *cmd;
  wchar_t wVar20;
  code *pred;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  wchar_t wVar25;
  player *ppVar26;
  uint uVar27;
  uint uVar28;
  wchar_t wVar29;
  ulong uVar30;
  bool bVar31;
  ui_event e;
  ui_event e_00;
  ui_event e_01;
  ui_event e_02;
  ui_event e_03;
  ui_event e_04;
  ui_event e_05;
  ui_event e_06;
  ui_event e_07;
  ui_event e_08;
  ui_event e_09;
  ui_event e_10;
  ui_event e_11;
  ui_event e_12;
  ui_event e_13;
  ui_event e_14;
  ui_event e_15;
  ui_event e_16;
  ui_event e_17;
  ui_event e_18;
  ui_event e_19;
  ui_event e_20;
  ui_event e_21;
  ui_event e_22;
  keypress ch;
  keypress ch_00;
  _Bool *show_interesting_00;
  wchar_t *target_index_00;
  _Bool show_interesting;
  wchar_t local_8e8;
  wchar_t local_8e4;
  wchar_t local_8e0;
  wchar_t target_index;
  point_set *targets;
  undefined4 local_8cc;
  uint local_8c8;
  undefined1 local_8c1;
  ulong local_8c0;
  object *local_8b8;
  ulong local_8b0;
  wchar_t local_8a4;
  void *local_8a0;
  void *local_898;
  uint local_890;
  wchar_t local_88c;
  wchar_t hgt;
  wchar_t wid;
  loc new_grid;
  ui_event local_850 [2];
  loc path_g [256];
  undefined7 extraout_var;
  
  show_interesting = true;
  local_8e0 = mode;
  bVar7 = cmd_lookup_key(CMD_IGNORE,(uint)(player->opts).opt[1]);
  local_898 = mem_zalloc((ulong)z_info->max_range << 2);
  local_8a0 = mem_zalloc((ulong)z_info->max_range << 2);
  pcVar6 = cave;
  if (y != L'\xffffffff' && x != L'\xffffffff') {
    lVar15 = (loc)loc(x,y);
    _Var8 = square_in_bounds_fully(pcVar6,lVar15);
    if (_Var8) {
      show_interesting = false;
      local_8e8 = x;
      local_8e4 = y;
      goto LAB_00207a05;
    }
  }
  local_8e8 = (player->grid).x;
  local_8e4 = (player->grid).y;
LAB_00207a05:
  local_890 = (uint)bVar7;
  target_set_monster((monster *)0x0);
  disallow_animations();
  Term_get_size(&wid,&hgt);
  local_8a4 = hgt + L'\xffffffff';
  prt("Press \'?\' for help.",local_8a4,L'\0');
  targets = target_get_monsters(local_8e0,(monster_predicate)0x0,true);
  target_index = L'\0';
  local_8c0 = 0;
LAB_00207a73:
  do {
    _Var8 = true;
    if ((show_interesting == true) &&
       (iVar12 = point_set_size((point_set_conflict *)targets), iVar12 != 0)) {
      local_8e8 = targets->pts[target_index].x;
      local_8e4 = targets->pts[target_index].y;
      _Var8 = false;
      adjust_panel_help(local_8e4,local_8e8,(_Bool)((byte)local_8c0 & 1),player,local_8e0,
                        (point_set **)0x0,(_Bool *)0x0,(int *)0x0);
      local_8cc = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      local_8cc = 0;
    }
    wVar29 = local_8e4;
    wVar25 = local_8e8;
    pcVar6 = cave;
    if ((local_8c0 & 1) != 0) {
      lVar15 = (loc)loc(local_8e8,local_8e4);
      pmVar16 = square_monster(pcVar6,lVar15);
      monster = target_able(pmVar16);
      pcVar6 = cave;
      if ((local_8e0 & 1U) == 0) {
        lVar15 = (loc)loc(wVar25,wVar29);
        poVar17 = square_object(pcVar6,lVar15);
        if (poVar17 == (object *)0x0) {
          _Var9 = false;
        }
        else {
          do {
            _Var9 = is_unknown(cave->objects[poVar17->oidx]);
            if (!_Var9) break;
            poVar17 = poVar17->next;
          } while (poVar17 != (object *)0x0);
          _Var9 = !_Var9;
        }
      }
      else {
        _Var9 = false;
      }
      target_display_help(monster,_Var9,_Var8);
    }
    pcVar6 = cave;
    uVar11 = z_info->max_range;
    lVar15 = (loc)loc((player->grid).x,(player->grid).y);
    wVar25 = local_8e8;
    grid2 = (loc)loc(local_8e8,local_8e4);
    local_88c = project_path((chunk *)pcVar6,path_g,(uint)uVar11,lVar15,grid2,L'င');
    if (((local_8e0 & 1U) == 0) || (uVar21 = local_88c & 0xffff, uVar21 == 0)) {
      local_8b8 = (object *)((ulong)local_8b8 & 0xffffffff00000000);
    }
    else {
      _Var8 = panel_contains((player->grid).y,(player->grid).x);
      uVar27 = (uint)_Var8;
      local_8b0 = (ulong)(uVar21 << 2);
      uVar30 = 0;
      local_8c8 = 0;
      do {
        wVar25 = *(wchar_t *)((long)&path_g[0].x + uVar30 * 2);
        wVar29 = *(wchar_t *)((long)&path_g[0].y + uVar30 * 2);
        lVar15.y = wVar29;
        lVar15.x = wVar25;
        pmVar16 = square_monster(cave,lVar15);
        local_8b8 = square_object((chunk_conflict *)player->cave,lVar15);
        _Var8 = panel_contains(wVar29,wVar25);
        uVar18 = CONCAT71(extraout_var,_Var8);
        if (_Var8) {
          local_8c1 = _Var8;
          move_cursor_relative(wVar29,wVar25);
          eVar13 = Term_what(Term->scr->cx,Term->scr->cy,(int *)((long)local_8a0 + uVar30),
                             (wchar_t *)((long)local_898 + uVar30));
          if ((local_8c8 & 1) == 0) {
            if ((pmVar16 == (monster *)0x0) || (_Var8 = monster_is_visible(pmVar16), !_Var8)) {
              uVar22 = local_8b0;
              if (local_8b8 == (object *)0x0) {
                _Var8 = square_isknown(cave,lVar15);
                if ((!_Var8) ||
                   (_Var8 = square_isprojectable((chunk_conflict *)player->cave,lVar15), _Var8)) {
                  _Var8 = square_isknown(cave,lVar15);
                  wVar25 = L'\b';
                  if (_Var8) {
                    wVar25 = L'\x01';
                  }
                  local_8c8 = (uint)CONCAT71(extraout_var_00,_Var8) ^ 1;
                  goto LAB_00207de7;
                }
LAB_00207e24:
                wVar25 = L'\x06';
              }
              else {
                wVar25 = L'\v';
              }
LAB_00207d7e:
              local_8c8 = 0;
            }
            else {
              _Var8 = monster_is_mimicking(pmVar16);
              wVar25 = L'\v';
              if (!_Var8) {
                _Var8 = monster_is_camouflaged(pmVar16);
                uVar22 = local_8b0;
                if (_Var8) {
                  if (local_8b8 == (object *)0x0) {
                    _Var8 = square_isknown(cave,lVar15);
                    if ((_Var8) &&
                       (_Var8 = square_isprojectable((chunk_conflict *)player->cave,lVar15), !_Var8)
                       ) goto LAB_00207e24;
                    wVar25 = L'\x01';
                  }
                  goto LAB_00207d7e;
                }
                wVar25 = L'\f';
              }
              local_8c8 = 0;
              uVar22 = local_8b0;
            }
          }
          else {
            local_8c8 = (uint)CONCAT71((uint7)(uint3)((uint)eVar13 >> 8),1);
            wVar25 = L'\b';
            uVar22 = local_8b0;
          }
LAB_00207de7:
          eVar13 = Term_addch(wVar25,L'*');
          uVar18 = (ulong)CONCAT31((int3)((uint)eVar13 >> 8),local_8c1);
        }
        else {
          uVar22 = local_8b0;
          if ((uVar27 & 1) != 0) {
            local_8b8 = (object *)CONCAT44(local_8b8._4_4_,(int)CONCAT71(extraout_var,uVar30 != 0));
            wVar25 = local_8e8;
            goto LAB_00207e6a;
          }
        }
        uVar30 = uVar30 + 4;
        uVar27 = (uint)uVar18;
      } while (uVar22 != uVar30);
      local_8b8 = (object *)CONCAT44(local_8b8._4_4_,(int)CONCAT71((int7)(uVar18 >> 8),1));
      wVar25 = local_8e8;
    }
LAB_00207e6a:
    ppVar26 = (player *)0x14;
    coords_desc((char *)&new_grid,L'\x14',local_8e4,wVar25);
    _Var8 = aux_reinit((chunk *)cave,ppVar26,(target_aux_state *)&new_grid);
    if (!_Var8) {
      iVar12 = 0;
      do {
        iVar24 = iVar12 + 1;
        if (5 < iVar12) {
          iVar24 = 0;
        }
        cVar10 = (*(code *)(&PTR_aux_reinit_002857a0)[iVar24])
                           (cave,player,(target_aux_state *)&new_grid);
        iVar12 = iVar24;
      } while (cVar10 == '\0');
    }
    ch_00.mods = local_850[0].key.mods;
    ch_00._0_8_ = local_850[0].mouse;
    ch.mods = local_850[0].key.mods;
    ch._0_8_ = local_850[0].mouse;
    e_22.key.mods = local_850[0].key.mods;
    e_22.mouse = (mouseclick)local_850[0]._0_8_;
    e_21.key.mods = local_850[0].key.mods;
    e_21.mouse = (mouseclick)local_850[0]._0_8_;
    e_20.key.mods = local_850[0].key.mods;
    e_20.mouse = (mouseclick)local_850[0]._0_8_;
    e_19.key.mods = local_850[0].key.mods;
    e_19.mouse = (mouseclick)local_850[0]._0_8_;
    e_18.key.mods = local_850[0].key.mods;
    e_18.mouse = (mouseclick)local_850[0]._0_8_;
    e_17.key.mods = local_850[0].key.mods;
    e_17.mouse = (mouseclick)local_850[0]._0_8_;
    e_16.key.mods = local_850[0].key.mods;
    e_16.mouse = (mouseclick)local_850[0]._0_8_;
    e_15.key.mods = local_850[0].key.mods;
    e_15.mouse = (mouseclick)local_850[0]._0_8_;
    e_14.key.mods = local_850[0].key.mods;
    e_14.mouse = (mouseclick)local_850[0]._0_8_;
    e_13.key.mods = local_850[0].key.mods;
    e_13.mouse = (mouseclick)local_850[0]._0_8_;
    e_12.key.mods = local_850[0].key.mods;
    e_12.mouse = (mouseclick)local_850[0]._0_8_;
    e_11.key.mods = local_850[0].key.mods;
    e_11.mouse = (mouseclick)local_850[0]._0_8_;
    e_10.key.mods = local_850[0].key.mods;
    e_10.mouse = (mouseclick)local_850[0]._0_8_;
    e_09.key.mods = local_850[0].key.mods;
    e_09.mouse = (mouseclick)local_850[0]._0_8_;
    e_08.key.mods = local_850[0].key.mods;
    e_08.mouse = (mouseclick)local_850[0]._0_8_;
    e_07.key.mods = local_850[0].key.mods;
    e_07.mouse = (mouseclick)local_850[0]._0_8_;
    e_06.key.mods = local_850[0].key.mods;
    e_06.mouse = (mouseclick)local_850[0]._0_8_;
    e_05.key.mods = local_850[0].key.mods;
    e_05.mouse = (mouseclick)local_850[0]._0_8_;
    e_04.key.mods = local_850[0].key.mods;
    e_04.mouse = (mouseclick)local_850[0]._0_8_;
    e_03.key.mods = local_850[0].key.mods;
    e_03.mouse = (mouseclick)local_850[0]._0_8_;
    e_02.key.mods = local_850[0].key.mods;
    e_02.mouse = (mouseclick)local_850[0]._0_8_;
    e_01.key.mods = local_850[0].key.mods;
    e_01.mouse = (mouseclick)local_850[0]._0_8_;
    e_00.key.mods = local_850[0].key.mods;
    e_00.mouse = (mouseclick)local_850[0]._0_8_;
    e.key.mods = local_850[0].key.mods;
    e.mouse = (mouseclick)local_850[0]._0_8_;
    if ((char)local_8b8 != '\0') {
      uVar21 = local_88c & 0xffff;
      if (uVar21 != 0) {
        uVar30 = 0;
        do {
          wVar25 = path_g[uVar30].x;
          wVar29 = path_g[uVar30].y;
          _Var8 = panel_contains(wVar29,wVar25);
          if (_Var8) {
            move_cursor_relative(wVar29,wVar25);
            Term_addch(*(wchar_t *)((long)local_8a0 + uVar30 * 4),
                       *(wchar_t *)((long)local_898 + uVar30 * 4));
          }
          uVar30 = uVar30 + 1;
        } while (uVar21 != uVar30);
      }
      Term_fresh();
    }
    e._9_3_ = 0;
    _Var8 = event_is_mouse_m(e,'\x02','\x01');
    uVar21 = SUB84(local_850[0].mouse,4);
    if ((!_Var8) && (e_00._9_3_ = 0, _Var8 = event_is_mouse(e_00,'\x03'), !_Var8)) {
      e_01._9_3_ = 0;
      _Var8 = event_is_mouse_m(e_01,'\x02','\x04');
      if (_Var8) {
        iVar12 = row_top_map[Term->sidebar_mode];
        uVar28 = (uint)tile_height;
        iVar24 = Term->offset_y;
        iVar4 = col_map[Term->sidebar_mode];
        uVar27 = (uint)tile_width;
        iVar5 = Term->offset_x;
        cmdq_push(CMD_PATHFIND);
        cmd = cmdq_peek();
        lVar15 = (loc)loc((int)((uVar21 & 0xff) - iVar4) / (int)uVar27 + iVar5,
                          (int)((uVar21 >> 8 & 0xff) - iVar12) / (int)uVar28 + iVar24);
LAB_0020890f:
        cmd_set_arg_point(cmd,"point",lVar15);
        goto LAB_00208994;
      }
      e_02._9_3_ = 0;
      _Var8 = event_is_mouse(e_02,'\x02');
      if (_Var8) {
        if ((((local_8e0 & 1U) != 0 && (char)local_8cc == '\0') &&
            (local_8e4 ==
             (int)((uVar21 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height
             + Term->offset_y)) &&
           (wVar29 = local_8e4, wVar25 = local_8e8,
           local_8e8 ==
           (int)((uVar21 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
           Term->offset_x)) goto LAB_00208872;
        goto LAB_00208994;
      }
      e_03._9_3_ = 0;
      _Var8 = event_is_mouse(e_03,'\x01');
      if (_Var8) {
        uVar27 = uVar21 >> 8 & 0xff;
        wVar20 = (int)(uVar27 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
                 Term->offset_y;
        uVar21 = uVar21 & 0xff;
        wVar29 = (int)(uVar21 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
                 Term->offset_x;
        if (uVar27 < 2) {
          wVar20 = wVar20 + L'\xffffffff';
        }
        else if ((int)uVar27 < Term->hgt + -2) {
          if (col_map[Term->sidebar_mode] < (int)uVar21) {
            wVar29 = wVar29 + (uint)(Term->wid + -2 <= (int)uVar21);
          }
          else {
            wVar29 = wVar29 + L'\xffffffff';
          }
        }
        else {
          wVar20 = wVar20 + L'\x01';
        }
        wVar25 = cave->width + L'\xffffffff';
        if (wVar29 < cave->width) {
          wVar25 = wVar29;
        }
        if (wVar25 < L'\x01') {
          wVar25 = L'\0';
        }
        wVar29 = cave->height + L'\xffffffff';
        if (wVar20 < cave->height) {
          wVar29 = wVar20;
        }
        if (wVar29 < L'\x01') {
          wVar29 = L'\0';
        }
LAB_00208225:
        target_index_00 = &target_index;
        show_interesting_00 = &show_interesting;
LAB_0020824f:
        local_8e8 = wVar25;
        local_8e4 = wVar29;
        adjust_panel_help(wVar29,wVar25,(_Bool)((byte)local_8c0 & 1),player,local_8e0,&targets,
                          show_interesting_00,target_index_00);
        goto LAB_00207a73;
      }
      e_04._9_3_ = 0;
      _Var8 = event_is_key(e_04,0xe000);
      if ((_Var8) || (e_05._9_3_ = 0, _Var8 = event_is_key(e_05,0x71), _Var8)) goto LAB_00208994;
      e_06._9_3_ = 0;
      _Var8 = event_is_key(e_06,0x20);
      if ((_Var8) ||
         ((e_07._9_3_ = 0, _Var8 = event_is_key(e_07,0x2a), _Var8 ||
          (e_08._9_3_ = 0, _Var8 = event_is_key(e_08,0x2b), _Var8)))) {
        if ((char)local_8cc != '\0') {
          wVar29 = target_index + L'\x01';
          target_index = wVar29;
          wVar25 = point_set_size((point_set_conflict *)targets);
          if (wVar29 == wVar25) {
            target_index = L'\0';
          }
        }
      }
      else {
        e_09._9_3_ = 0;
        _Var8 = event_is_key(e_09,0x2d);
        if (_Var8) {
          if (((char)local_8cc != '\0') &&
             (bVar31 = target_index == L'\0', target_index = target_index + L'\xffffffff', bVar31))
          {
            iVar12 = point_set_size((point_set_conflict *)targets);
            target_index = iVar12 + L'\xffffffff';
          }
          goto LAB_00207a73;
        }
        e_10._9_3_ = 0;
        _Var8 = event_is_key(e_10,0x70);
        if (_Var8) {
          local_8e8 = (player->grid).x;
          local_8e4 = (player->grid).y;
          show_interesting = false;
          verify_panel();
          handle_stuff(player);
          goto LAB_00207a73;
        }
        e_11._9_3_ = 0;
        _Var8 = event_is_key(e_11,0x6f);
        if (_Var8) {
          show_interesting = false;
          goto LAB_00207a73;
        }
        e_12._9_3_ = 0;
        _Var8 = event_is_key(e_12,0x6d);
        if (_Var8) {
          if (((char)local_8cc == '\0') &&
             (iVar12 = point_set_size((point_set_conflict *)targets), 0 < iVar12)) {
            show_interesting = true;
            target_index = L'\0';
            iVar12 = point_set_size((point_set_conflict *)targets);
            wVar29 = local_8e4;
            wVar25 = local_8e8;
            if (0 < iVar12) {
              wVar20 = L'ϧ';
              lVar23 = 0;
              do {
                lVar19 = loc(wVar25,wVar29);
                wVar14 = distance(lVar19,(loc_conflict)targets->pts[lVar23]);
                if (wVar14 < wVar20) {
                  target_index = (wchar_t)lVar23;
                  wVar20 = wVar14;
                }
                lVar23 = lVar23 + 1;
                iVar12 = point_set_size((point_set_conflict *)targets);
              } while (lVar23 < iVar12);
            }
          }
          goto LAB_00207a73;
        }
        e_13._9_3_ = 0;
        _Var8 = event_is_key(e_13,0x74);
        if ((((_Var8) || (e_14._9_3_ = 0, _Var8 = event_is_key(e_14,0x35), _Var8)) ||
            (e_15._9_3_ = 0, _Var8 = event_is_key(e_15,0x30), _Var8)) ||
           (e_16._9_3_ = 0, _Var8 = event_is_key(e_16,0x2e), _Var8)) {
          pcVar6 = cave;
          wVar29 = local_8e4;
          wVar25 = local_8e8;
          if ((char)local_8cc == '\0') goto LAB_00208872;
          lVar15 = (loc)loc(local_8e8,local_8e4);
          pmVar16 = square_monster(pcVar6,lVar15);
          _Var8 = target_able(pmVar16);
          if (_Var8) {
LAB_0020887c:
            target_set_monster(pmVar16);
LAB_00208994:
            point_set_dispose((point_set_conflict *)targets);
            if ((local_8c0 & 1) == 0) {
              prt("",L'\0',L'\0');
              prt("",local_8a4,L'\0');
              puVar1 = &player->upkeep->redraw;
              *puVar1 = *puVar1 | 0x3000;
            }
            else {
              puVar1 = &player->upkeep->redraw;
              *puVar1 = *puVar1 | 0x5bfff;
              Term_clear();
            }
            verify_panel();
            handle_stuff(player);
            mem_free(local_8a0);
            mem_free(local_898);
            allow_animations();
            _Var8 = target_is_set();
            return _Var8;
          }
        }
        else {
          e_17._9_3_ = 0;
          _Var8 = event_is_key(e_17,0x67);
          if (_Var8) {
            cmdq_push(CMD_PATHFIND);
            cmd = cmdq_peek();
            lVar15 = (loc)loc(local_8e8,local_8e4);
            goto LAB_0020890f;
          }
          e_18._9_3_ = 0;
          _Var8 = event_is_key(e_18,local_890);
          pcVar6 = cave;
          if (_Var8) {
            if ((local_8e0 & 1U) == 0) {
              lVar15 = (loc)loc(local_8e8,local_8e4);
              poVar17 = square_object(pcVar6,lVar15);
              if (poVar17 != (object *)0x0) {
                obj = player->upkeep->object;
                do {
                  if (obj == poVar17) {
                    textui_cmd_ignore_menu(obj);
                    handle_stuff(player);
                    point_set_dispose((point_set_conflict *)targets);
                    targets = target_get_monsters(local_8e0,(monster_predicate)0x0,true);
                    break;
                  }
                  poVar17 = poVar17->next;
                } while (poVar17 != (object *)0x0);
              }
            }
            goto LAB_00207a73;
          }
          e_19._9_3_ = 0;
          _Var8 = event_is_key(e_19,0x3e);
          ppVar26 = player;
          if (!_Var8) {
            e_20._9_3_ = 0;
            _Var8 = event_is_key(e_20,0x3c);
            ppVar26 = player;
            if (_Var8) {
              lVar19 = loc(local_8e8,local_8e4);
              pred = square_isupstairs;
              goto LAB_0020850f;
            }
            e_21._9_3_ = 0;
            _Var8 = event_is_key(e_21,0x78);
            ppVar26 = player;
            if (_Var8) {
              lVar19 = loc(local_8e8,local_8e4);
              wVar25 = path_nearest_unknown
                                 (ppVar26,lVar19,(loc_conflict *)&new_grid,(int16_t **)0x0);
              if (wVar25 < L'\x01') {
LAB_002086de:
                bell();
              }
              else {
                local_8e4 = new_grid.y;
                local_8e8 = new_grid.x;
                adjust_panel_help(new_grid.y,new_grid.x,(_Bool)((byte)local_8c0 & 1),player,
                                  local_8e0,&targets,&show_interesting,&target_index);
              }
              goto LAB_00207a73;
            }
            e_22._9_3_ = 0;
            _Var8 = event_is_key(e_22,0x3f);
            uVar30 = local_8c0;
            if (_Var8) {
              uVar18 = local_8c0 & 0xffffffff ^ 1;
              puVar1 = &player->upkeep->redraw;
              *puVar1 = *puVar1 | 0x5bfff;
              Term_clear();
              handle_stuff(player);
              local_8c0 = uVar18;
              if ((uVar30 & 1) != 0) {
                prt("Press \'?\' for help.",local_8a4,L'\0');
                local_8c0 = uVar18;
              }
              goto LAB_00207a73;
            }
            ch._9_3_ = 0;
            wVar25 = target_dir_allow(ch,false);
            if (wVar25 == L'\0') goto LAB_002086de;
            if ((char)local_8cc == '\0') {
              ch_00._9_3_ = 0;
              _Var8 = is_running_keymap(ch_00);
              iVar12 = (uint)_Var8 + (uint)_Var8 * 8 + 1;
              local_8e8 = ddx[wVar25] * iVar12 + local_8e8;
              local_8e4 = ddy[wVar25] * iVar12 + local_8e4;
              wVar25 = cave->width + L'\xfffffffe';
              if (local_8e8 < wVar25) {
                wVar25 = local_8e8;
              }
              if (wVar25 < L'\x02') {
                wVar25 = L'\x01';
              }
              wVar29 = cave->height + L'\xfffffffe';
              if (local_8e4 < wVar29) {
                wVar29 = local_8e4;
              }
              if (wVar29 < L'\x02') {
                wVar29 = L'\x01';
              }
              show_interesting_00 = (_Bool *)0x0;
              target_index_00 = (wchar_t *)0x0;
              goto LAB_0020824f;
            }
            wVar29 = targets->pts[target_index].x;
            wVar20 = targets->pts[target_index].y;
            sVar2 = ddy[wVar25];
            sVar3 = ddx[wVar25];
            uVar11 = target_pick(wVar20,wVar29,(int)sVar2,(int)sVar3,targets);
            if ((short)uVar11 < 0) {
              local_8b8 = (object *)CONCAT44(local_8b8._4_4_,Term->offset_x);
              local_8b0 = CONCAT44(local_8b0._4_4_,Term->offset_y);
              _Var8 = change_panel(wVar25);
              if (!_Var8) goto LAB_00207a73;
              point_set_dispose((point_set_conflict *)targets);
              targets = target_get_monsters(local_8e0,(monster_predicate)0x0,true);
              uVar11 = target_pick(wVar20,wVar29,(int)sVar2,(int)sVar3,targets);
              if ((short)uVar11 < 0) {
                _Var8 = modify_panel((term_conflict *)Term,(wchar_t)local_8b0,(wchar_t)local_8b8);
                if (_Var8) {
                  point_set_dispose((point_set_conflict *)targets);
                  targets = target_get_monsters(local_8e0,(monster_predicate)0x0,true);
                }
                handle_stuff(player);
                goto LAB_00207a73;
              }
              handle_stuff(player);
            }
            target_index = (wchar_t)uVar11;
            goto LAB_00207a73;
          }
          lVar19 = loc(local_8e8,local_8e4);
          pred = square_isdownstairs;
LAB_0020850f:
          wVar20 = path_nearest_known(ppVar26,lVar19,pred,(loc_conflict *)&new_grid,(int16_t **)0x0)
          ;
          wVar29 = new_grid.y;
          wVar25 = new_grid.x;
          if (L'\0' < wVar20) goto LAB_00208225;
        }
        bell();
      }
      goto LAB_00207a73;
    }
    pcVar6 = cave;
    wVar29 = (int)((uVar21 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height
             + Term->offset_y;
    wVar25 = (int)((uVar21 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
             Term->offset_x;
    if ((char)local_8cc == '\0') {
LAB_00208872:
      target_set_location(wVar29,wVar25);
      goto LAB_00208994;
    }
    lVar15 = (loc)loc(wVar25,wVar29);
    pmVar16 = square_monster(pcVar6,lVar15);
    _Var8 = target_able(pmVar16);
    if (_Var8) goto LAB_0020887c;
    bell();
    pcVar6 = cave;
    local_8e8 = wVar25;
    local_8e4 = wVar29;
    lVar15 = (loc)loc(wVar25,wVar29);
    _Var8 = square_in_bounds(pcVar6,lVar15);
    if (!_Var8) {
      local_8e8 = (player->grid).x;
      local_8e4 = (player->grid).y;
    }
  } while( true );
}

Assistant:

bool target_set_interactive(int mode, int x, int y)
{
	int path_n;
	struct loc path_g[256];

	int wid, hgt, help_prompt_loc;

	bool done = false;
	bool show_interesting = true;
	bool help = false;
	keycode_t ignore_key = cmd_lookup_key(CMD_IGNORE,
		(OPT(player, rogue_like_commands)) ?
		KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG);

	/* These are used for displaying the path to the target */
	wchar_t *path_char = mem_zalloc(z_info->max_range * sizeof(wchar_t));
	int *path_attr = mem_zalloc(z_info->max_range * sizeof(int));

	/* If we haven't been given an initial location, start on the
	   player, otherwise  honour it by going into "free targetting" mode. */
	if (x == -1 || y == -1 || !square_in_bounds_fully(cave, loc(x, y))) {
		x = player->grid.x;
		y = player->grid.y;
	} else {
		show_interesting = false;
	}

	/* Cancel target */
	target_set_monster(0);

	/* Prevent animations */
	disallow_animations();

	/* Calculate the window location for the help prompt */
	Term_get_size(&wid, &hgt);
	help_prompt_loc = hgt - 1;
	
	/* Display the help prompt */
	prt("Press '?' for help.", help_prompt_loc, 0);

	/* Prepare the target set */
	struct point_set *targets = target_get_monsters(mode, NULL, true);
	int target_index = 0;

	/* Interact */
	while (!done) {
		bool path_drawn = false;
		bool use_interesting_mode = show_interesting && point_set_size(targets);
		bool use_free_mode = !use_interesting_mode;

		/* Use an interesting grid if requested and there are any */
		if (use_interesting_mode) {
			y = targets->pts[target_index].y;
			x = targets->pts[target_index].x;

			/* Adjust panel if needed */
			adjust_panel_help(y, x, help, player, mode, NULL,
				NULL, NULL);
		}

		/* Update help */
		if (help) {
			bool has_target = target_able(square_monster(cave, loc(x, y)));
			bool has_object = !(mode & TARGET_KILL)
					&& pile_has_known(square_object(cave, loc(x, y)));
			target_display_help(has_target, has_object, use_free_mode);
		}

		/* Find the path. */
		path_n = project_path(cave, path_g, z_info->max_range,
							  loc(player->grid.x, player->grid.y), loc(x, y),
							  PROJECT_THRU | PROJECT_INFO);

		/* Draw the path in "target" mode. If there is one */
		if (mode & (TARGET_KILL))
			path_drawn = draw_path(path_n, path_g, path_char, path_attr,
					player->grid.y, player->grid.x);

		/* Describe and Prompt */
		ui_event press = target_set_interactive_aux(y, x,
				mode | (use_free_mode ? TARGET_LOOK : 0));

		/* Remove the path */
		if (path_drawn) load_path(path_n, path_g, path_char, path_attr);

		/* Handle an input event */
		if (event_is_mouse_m(press, 2, KC_MOD_CONTROL) || event_is_mouse(press, 3)) {
			/* Set a target and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			if (use_free_mode) {
				/* Free mode: Target a location */
				target_set_location(y, x);
				done = true;
			} else {
				/* Interesting mode: Try to target a monster and done, or bell */
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
					if (!square_in_bounds(cave, loc(x, y))) {
						x = player->grid.x;
						y = player->grid.y;
					}
				}
			}

		} else if (event_is_mouse_m(press, 2, KC_MOD_ALT)) {
			/* Navigate to location and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_mouse(press, 2)) {
			/* Cancel and done */
			if (use_free_mode && (mode & TARGET_KILL)
					&& y == KEY_GRID_Y(press) && x == KEY_GRID_X(press)) {
				/* Free/kill mode: Clicked current location, set target */
				target_set_location(y, x);
			}
			done = true;

		} else if (event_is_mouse(press, 1)) {
			/* Relocate cursor */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);

			/* If they clicked on an edge of the map, drag the cursor further
			   to trigger a panel scroll */
			if (press.mouse.y <= 1) {
				y--;
			} else if (press.mouse.y >= Term->hgt - 2) {
				y++;
			} else if (press.mouse.x <= COL_MAP) {
				x--;
			} else if (press.mouse.x >= Term->wid - 2) {
				x++;
			}

			/* Restrict cursor to inbounds */
			x = MAX(0, MIN(x, cave->width - 1));
			y = MAX(0, MIN(y, cave->height - 1));

			/*
			 * Adjust panel and target list if needed; also
			 * adjust interesting mode
			 */
			adjust_panel_help(y, x, help, player, mode, &targets,
				&show_interesting, &target_index);

		} else if (event_is_key(press, ESCAPE) || event_is_key(press, 'q')) {
			/* Cancel */
			done = true;

		} else if (event_is_key(press, ' ') || event_is_key(press, '*')
				|| event_is_key(press, '+')) {
			/* Cycle interesting target forward */
			if (use_interesting_mode && ++target_index == point_set_size(targets)) {
				target_index = 0;
			}

		} else if (event_is_key(press, '-')) {
			/* Cycle interesting target backwards */
			if (use_interesting_mode && target_index-- == 0) {
				target_index = point_set_size(targets) - 1;
			}

		} else if (event_is_key(press, 'p')) {
			/* Focus the player and switch to free mode */
			y = player->grid.y;
			x = player->grid.x;
			show_interesting = false;

			/* Recenter around player */
			verify_panel();
			handle_stuff(player);

		} else if (event_is_key(press, 'o')) {
			/* Switch to free mode */
			show_interesting = false;

		} else if (event_is_key(press, 'm')) {
			/* Switch to interesting mode */
			if (use_free_mode && point_set_size(targets) > 0) {
				show_interesting = true;
				target_index = 0;
				int min_dist = 999;

				/* Pick the nearest interesting target */
				for (int i = 0; i < point_set_size(targets); i++) {
					int dist = distance(loc(x, y), targets->pts[i]);
					if (dist < min_dist) {
						target_index = i;
						min_dist = dist;
					}
				}
			}

		} else if (event_is_key(press, 't') || event_is_key(press, '5')
				|| event_is_key(press, '0') || event_is_key(press, '.')) {
			/* Set a target and done */
			if (use_interesting_mode) {
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
				}
			} else {
				target_set_location(y, x);
				done = true;
			}

		} else if (event_is_key(press, 'g')) {
			/* Navigate to a location and done */
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_key(press, ignore_key)) {
			/* Ignore the tracked object, set by target_set_interactive_aux() */
			if (!(mode & TARGET_KILL)
					&& pile_is_tracked(square_object(cave, loc(x, y)))) {
				textui_cmd_ignore_menu(player->upkeep->object);
				handle_stuff(player);

				/* Recalculate interesting grids */
				point_set_dispose(targets);
				targets = target_get_monsters(mode, NULL, true);
			}

		} else if (event_is_key(press, '>')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isdownstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '<')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isupstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, 'x')) {
			struct loc new_grid;

			if (path_nearest_unknown(player, loc(x, y), &new_grid,
					NULL) > 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '?')) {
			/* Toggle help text */
			help = !help;

			/* Redraw main window */
			player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
			Term_clear();
			handle_stuff(player);
			if (!help)
				prt("Press '?' for help.", help_prompt_loc, 0);

		} else {
			/* Try to extract a direction from the key press */
			int dir = target_dir(press.key);

			if (!dir) {
				bell();
			} else if (use_interesting_mode) {
				/* Interesting mode direction: Pick new interesting grid */
				int old_y = targets->pts[target_index].y;
				int old_x = targets->pts[target_index].x;
				int new_index;

				/* Look for a new interesting grid */
				new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

				/* If none found, try in the next panel */
				if (new_index < 0) {
					int old_wy = Term->offset_y;
					int old_wx = Term->offset_x;

					if (change_panel(dir)) {
						/* Recalculate interesting grids */
						point_set_dispose(targets);
						targets = target_get_monsters(mode, NULL, true);

						/* Look for a new interesting grid again */
						new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

						/* If none found again, reset the panel and do nothing */
						if (new_index < 0 && modify_panel(Term, old_wy, old_wx)) {
							/* Recalculate interesting grids */
							point_set_dispose(targets);
							targets = target_get_monsters(mode, NULL, true);
						}

						handle_stuff(player);
					}
				}

				/* Use interesting grid if found */
				if (new_index >= 0) target_index = new_index;
			} else {
				int step = (is_running_keymap(press.key)) ?
					10 : 1;

				/* Free mode direction: Move cursor */
				x += step * ddx[dir];
				y += step * ddy[dir];

				/* Keep 1 away from the edge */
				x = MAX(1, MIN(x, cave->width - 2));
				y = MAX(1, MIN(y, cave->height - 2));

				/* Adjust panel and target list if needed */
				adjust_panel_help(y, x, help, player, mode,
					&targets, NULL, NULL);
			}
		}
		/* End of while finally */
	}

	/* Forget */
	point_set_dispose(targets);

	/* Redraw as necessary */
	if (help) {
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
		Term_clear();
	} else {
		prt("", 0, 0);
		prt("", help_prompt_loc, 0);
		player->upkeep->redraw |= (PR_DEPTH | PR_STATUS);
	}

	/* Recenter around player */
	verify_panel();

	handle_stuff(player);

	mem_free(path_attr);
	mem_free(path_char);

	/* Allow animations again */
	allow_animations();

	return target_is_set();
}